

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int nextScaffoldPart(XML_Parser parser)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  CONTENT_SCAFFOLD *parent;
  int next;
  CONTENT_SCAFFOLD *me;
  XML_Parser parser_local;
  
  if (*(long *)((long)parser + 0x3c0) == 0) {
    uVar2 = (**(code **)((long)parser + 0x18))((ulong)*(uint *)((long)parser + 0x480) << 2);
    *(undefined8 *)((long)parser + 0x3c0) = uVar2;
    if (*(long *)((long)parser + 0x3c0) == 0) {
      return -1;
    }
    **(undefined4 **)((long)parser + 0x3c0) = 0;
  }
  if (*(uint *)((long)parser + 0x3b4) <= *(uint *)((long)parser + 0x3b8)) {
    if (*(long *)((long)parser + 0x3a8) == 0) {
      *(undefined4 *)((long)parser + 0x3b4) = 0x20;
      uVar2 = (**(code **)((long)parser + 0x18))((ulong)*(uint *)((long)parser + 0x3b4) << 5);
      *(undefined8 *)((long)parser + 0x3a8) = uVar2;
    }
    else {
      *(int *)((long)parser + 0x3b4) = *(int *)((long)parser + 0x3b4) << 1;
      uVar2 = (**(code **)((long)parser + 0x20))
                        (*(undefined8 *)((long)parser + 0x3a8),
                         (ulong)*(uint *)((long)parser + 0x3b4) << 5);
      *(undefined8 *)((long)parser + 0x3a8) = uVar2;
    }
    if (*(long *)((long)parser + 0x3a8) == 0) {
      return -1;
    }
  }
  iVar1 = *(int *)((long)parser + 0x3b8);
  *(int *)((long)parser + 0x3b8) = iVar1 + 1;
  lVar3 = *(long *)((long)parser + 0x3a8) + (long)iVar1 * 0x20;
  if (*(int *)((long)parser + 0x3bc) != 0) {
    lVar4 = *(long *)((long)parser + 0x3a8) +
            (long)*(int *)(*(long *)((long)parser + 0x3c0) +
                          (long)(*(int *)((long)parser + 0x3bc) + -1) * 4) * 0x20;
    if (*(int *)(lVar4 + 0x14) != 0) {
      *(int *)(*(long *)((long)parser + 0x3a8) + (long)*(int *)(lVar4 + 0x14) * 0x20 + 0x1c) = iVar1
      ;
    }
    if (*(int *)(lVar4 + 0x18) == 0) {
      *(int *)(lVar4 + 0x10) = iVar1;
    }
    *(int *)(lVar4 + 0x14) = iVar1;
    *(int *)(lVar4 + 0x18) = *(int *)(lVar4 + 0x18) + 1;
  }
  *(undefined4 *)(lVar3 + 0x1c) = 0;
  *(undefined4 *)(lVar3 + 0x18) = 0;
  *(undefined4 *)(lVar3 + 0x14) = 0;
  *(undefined4 *)(lVar3 + 0x10) = 0;
  return iVar1;
}

Assistant:

static int
nextScaffoldPart(XML_Parser parser)
{
  CONTENT_SCAFFOLD * me;
  int next;

  if (! dtd.scaffIndex) {
    dtd.scaffIndex = MALLOC(groupSize * sizeof(int));
    if (! dtd.scaffIndex)
      return -1;
    dtd.scaffIndex[0] = 0;
  }

  if (dtd.scaffCount >= dtd.scaffSize) {
    if (dtd.scaffold) {
      dtd.scaffSize *= 2;
      dtd.scaffold = (CONTENT_SCAFFOLD *) REALLOC(dtd.scaffold,
                                              dtd.scaffSize * sizeof(CONTENT_SCAFFOLD));
    }
    else {
      dtd.scaffSize = 32;
      dtd.scaffold = (CONTENT_SCAFFOLD *) MALLOC(dtd.scaffSize * sizeof(CONTENT_SCAFFOLD));
    }
    if (! dtd.scaffold)
      return -1;
  }
  next = dtd.scaffCount++;
  me = &dtd.scaffold[next];
  if (dtd.scaffLevel) { 
    CONTENT_SCAFFOLD *parent = &dtd.scaffold[dtd.scaffIndex[dtd.scaffLevel - 1]];
    if (parent->lastchild) {
      dtd.scaffold[parent->lastchild].nextsib = next;
    }
    if (! parent->childcnt)
      parent->firstchild = next;
    parent->lastchild = next;
    parent->childcnt++;
  }
  me->firstchild = me->lastchild = me->childcnt = me->nextsib = 0;
  return next;
}